

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O2

ostream * ccd::Json::operator<<(ostream *os,Object *obj)

{
  long lVar1;
  int iVar2;
  long *plVar3;
  ostream *poVar4;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>
  _Var5;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>
  __x;
  _Rb_tree_header *p_Var6;
  
  if (operator<<(std::ostream&,std::map<std::__cxx11::string,ccd::Json::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ccd::Json::Value>>>const&)
      ::indentLvlIdx == '\0') {
    iVar2 = __cxa_guard_acquire(&operator<<(std::ostream&,std::map<std::__cxx11::string,ccd::Json::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ccd::Json::Value>>>const&)
                                 ::indentLvlIdx);
    if (iVar2 != 0) {
      operator<<::indentLvlIdx = std::ios_base::xalloc();
      __cxa_guard_release(&operator<<(std::ostream&,std::map<std::__cxx11::string,ccd::Json::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ccd::Json::Value>>>const&)
                           ::indentLvlIdx);
    }
  }
  plVar3 = std::ios_base::iword
                     ((ios_base *)(os + *(long *)(*(long *)os + -0x18)),operator<<::indentLvlIdx);
  std::operator<<(os,"{\n");
  *plVar3 = *plVar3 + 1;
  p_Var6 = &(obj->_M_t)._M_impl.super__Rb_tree_header;
  for (__x._M_node = (obj->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)__x._M_node != p_Var6;
      __x._M_node = (_Base_ptr)std::_Rb_tree_increment(__x._M_node)) {
    indent(os,(int)*plVar3);
    poVar4 = std::operator<<(os,"\"");
    poVar4 = std::operator<<(poVar4,(string *)(__x._M_node + 1));
    poVar4 = std::operator<<(poVar4,"\":");
    operator<<(poVar4,(Value *)(__x._M_node + 2));
    _Var5 = std::
            next<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,ccd::Json::Value>>>
                      (__x,1);
    if ((_Rb_tree_header *)_Var5._M_node != p_Var6) {
      std::operator<<(os,",\n");
    }
  }
  std::operator<<(os,"\n");
  lVar1 = *plVar3;
  *plVar3 = lVar1 + -1;
  indent(os,(int)(lVar1 + -1));
  std::operator<<(os,"}");
  return os;
}

Assistant:

std::ostream& operator<< ( std::ostream& os, const Object& obj )
{
	static const int indentLvlIdx =  os.xalloc();
	auto& indentLvl = os.iword(indentLvlIdx);
	os << "{\n";
	indentLvl++;

	for ( auto item = obj.cbegin() ; item != obj.cend(); ++item ) {
		indent ( os, indentLvl );
		os << "\"" << item->first << "\":" << item->second;
		if ( std::next(item, 1) != obj.cend() )
			os << ",\n";
	}
	os << "\n";

	indentLvl--;
	indent ( os, indentLvl );
	os << "}";

	return os;
}